

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vi.c
# Opt level: O2

el_action_t vi_undo(EditLine *el,wint_t c)

{
  wchar_t wVar1;
  long lVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  wchar_t *pwVar5;
  
  lVar2 = (el->el_chared).c_undo.len;
  if (lVar2 != -1) {
    pwVar3 = (el->el_chared).c_undo.buf;
    wVar1 = (el->el_chared).c_undo.cursor;
    pwVar4 = (el->el_line).buffer;
    pwVar5 = (el->el_line).cursor;
    (el->el_chared).c_undo.buf = pwVar4;
    (el->el_chared).c_undo.len = (long)(el->el_line).lastchar - (long)pwVar4 >> 2;
    (el->el_chared).c_undo.cursor = (wchar_t)((ulong)((long)pwVar5 - (long)pwVar4) >> 2);
    (el->el_line).limit = (wchar_t *)(((long)(el->el_line).limit - (long)pwVar4) + (long)pwVar3);
    (el->el_line).buffer = pwVar3;
    (el->el_line).cursor = pwVar3 + wVar1;
    (el->el_line).lastchar = pwVar3 + lVar2;
    return '\x04';
  }
  return '\x06';
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
vi_undo(EditLine *el, wint_t c __attribute__((__unused__)))
{
	c_undo_t un = el->el_chared.c_undo;

	if (un.len == -1)
		return CC_ERROR;

	/* switch line buffer and undo buffer */
	el->el_chared.c_undo.buf = el->el_line.buffer;
	el->el_chared.c_undo.len = el->el_line.lastchar - el->el_line.buffer;
	el->el_chared.c_undo.cursor =
	    (int)(el->el_line.cursor - el->el_line.buffer);
	el->el_line.limit = un.buf + (el->el_line.limit - el->el_line.buffer);
	el->el_line.buffer = un.buf;
	el->el_line.cursor = un.buf + un.cursor;
	el->el_line.lastchar = un.buf + un.len;

	return CC_REFRESH;
}